

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::SkipWhitespace(AsciiParser *this)

{
  bool bVar1;
  char local_19;
  AsciiParser *pAStack_18;
  char c;
  AsciiParser *this_local;
  
  pAStack_18 = this;
  do {
    bVar1 = Eof(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = Char1(this,&local_19);
    if (!bVar1) {
      return false;
    }
    (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
  } while (((local_19 == ' ') || (local_19 == '\t')) || (local_19 == '\f'));
  bVar1 = StreamReader::seek_from_current(this->_sr,-1);
  if (bVar1) {
    (this->_curr_cursor).col = (this->_curr_cursor).col + -1;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::SkipWhitespace() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }
    _curr_cursor.col++;

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      // continue
    } else {
      break;
    }
  }

  // unwind 1 char
  if (!_sr->seek_from_current(-1)) {
    return false;
  }
  _curr_cursor.col--;

  return true;
}